

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_HashPopulate(Kf_Set_t *p,Kf_Cut_t *pCut)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p->nTEntries != 0) {
    __assert_fail("p->nTEntries == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                  ,399,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
  }
  iVar3 = pCut->nLeaves;
  if (0 < iVar3) {
    lVar2 = 0;
    do {
      uVar1 = pCut->pLeaves[lVar2];
      if ((int)uVar1 < 1) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                      ,0x179,"int Kf_HashLookup(Kf_Set_t *, int)");
      }
      uVar4 = uVar1;
      while( true ) {
        uVar4 = p->TableMask & uVar4;
        uVar5 = (ulong)uVar4;
        if (p->pTable[uVar5] == 0) break;
        if (p->pTable[uVar5] == uVar1) {
          uVar5 = 0xffffffff;
          break;
        }
        uVar4 = uVar4 + 1;
      }
      if (((int)uVar5 != -1) && (uVar4 = p->nTEntries, uVar4 != p->nLutSize)) {
        if (p->pTable[uVar5] != 0) {
          __assert_fail("p->pTable[k] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                        ,0x186,"int Kf_HashFindOrAdd(Kf_Set_t *, int)");
        }
        p->pTable[uVar5] = uVar1;
        p->pPlace[(int)uVar4] = (int)uVar5;
        iVar3 = p->nTEntries;
        p->nTEntries = iVar3 + 1;
        p->pValue[uVar5] = iVar3;
      }
      lVar2 = lVar2 + 1;
      iVar3 = pCut->nLeaves;
    } while (lVar2 < iVar3);
  }
  if (p->nTEntries == iVar3) {
    return;
  }
  __assert_fail("p->nTEntries == pCut->nLeaves",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaKf.c"
                ,0x192,"void Kf_HashPopulate(Kf_Set_t *, Kf_Cut_t *)");
}

Assistant:

static inline void Kf_HashPopulate( Kf_Set_t * p, Kf_Cut_t * pCut )
{
    int i;
    assert( p->nTEntries == 0 );
    for ( i = 0; i < pCut->nLeaves; i++ )
        Kf_HashFindOrAdd( p, pCut->pLeaves[i] );
    assert( p->nTEntries == pCut->nLeaves );
}